

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_predict.h
# Opt level: O3

void MARGINAL::undo_marginal(data *sm,example *ec)

{
  byte bVar1;
  long lVar2;
  byte *pbVar3;
  features *pfVar4;
  undefined8 *puVar5;
  features *pfVar6;
  features *pfVar7;
  byte *pbVar8;
  undefined8 local_80 [12];
  float local_20;
  
  pbVar8 = (ec->super_example_predict).indices._begin;
  pbVar3 = (ec->super_example_predict).indices._end;
  if (pbVar8 != pbVar3) {
    do {
      bVar1 = *pbVar8;
      if (sm->id_features[bVar1] == true) {
        pfVar7 = (ec->super_example_predict).feature_space + bVar1;
        pfVar4 = sm->temp + bVar1;
        puVar5 = local_80;
        for (lVar2 = 0xd; lVar2 != 0; lVar2 = lVar2 + -1) {
          *puVar5 = (pfVar4->values)._begin;
          pfVar4 = (features *)&(pfVar4->values)._end;
          puVar5 = puVar5 + 1;
        }
        pfVar4 = pfVar7;
        pfVar6 = sm->temp + bVar1;
        for (lVar2 = 0xc; lVar2 != 0; lVar2 = lVar2 + -1) {
          (pfVar6->values)._begin = (pfVar4->values)._begin;
          pfVar4 = (features *)&(pfVar4->values)._end;
          pfVar6 = (features *)&(pfVar6->values)._end;
        }
        sm->temp[bVar1].sum_feat_sq = (ec->super_example_predict).feature_space[bVar1].sum_feat_sq;
        puVar5 = local_80;
        for (lVar2 = 0xc; lVar2 != 0; lVar2 = lVar2 + -1) {
          (pfVar7->values)._begin = (float *)*puVar5;
          puVar5 = puVar5 + 1;
          pfVar7 = (features *)&(pfVar7->values)._end;
        }
        (ec->super_example_predict).feature_space[bVar1].sum_feat_sq = local_20;
        pbVar3 = (ec->super_example_predict).indices._end;
      }
      pbVar8 = pbVar8 + 1;
    } while (pbVar8 != pbVar3);
  }
  return;
}

Assistant:

iterator end() { return iterator(feature_space, indices.end()); }